

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_utils.hpp
# Opt level: O2

string * PlatformUtilsGetSecureEnv_abi_cxx11_(string *__return_storage_ptr__,char *name)

{
  char *pcVar1;
  allocator local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pcVar1 = (char *)secure_getenv(name);
  if (pcVar1 == (char *)0x0) {
    pcVar1 = getenv(name);
    if (pcVar1 != (char *)0x0) {
      std::__cxx11::string::string((string *)&local_c8,pcVar1,(allocator *)&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
      if (local_c8._M_string_length != 0) {
        std::__cxx11::string::string
                  ((string *)&local_48,"!!! WARNING !!! Environment variable ",&local_c9);
        std::operator+(&local_88,&local_48,name);
        std::operator+(&local_68,&local_88,
                       " is being ignored due to running with secure execution. The value \'");
        std::operator+(&local_a8,&local_68,pcVar1);
        std::operator+(&local_c8,&local_a8,"\' will NOT be used.");
        LogPlatformUtilsError(&local_c8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_68);
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::~string((string *)&local_48);
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,(allocator *)&local_c8);
  }
  return __return_storage_ptr__;
}

Assistant:

static inline std::string PlatformUtilsGetSecureEnv(const char* name) {
    auto str = detail::ImplGetSecureEnv(name);
    if (str == nullptr) {
        str = detail::ImplGetEnv(name);
        if (str != nullptr && !std::string(str).empty()) {
            LogPlatformUtilsError(std::string("!!! WARNING !!! Environment variable ") + name +
                                  " is being ignored due to running with secure execution. The value '" + str +
                                  "' will NOT be used.");
        }
        return {};
    }
    return str;
}